

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

bool spvtools::anon_unknown_6::startsWithOp(spv_text text,spv_position position)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = position->index;
  if (((sVar1 + 3 <= text->length) && (pcVar2 = text->str, pcVar2[sVar1] == 'O')) &&
     (pcVar2[sVar1 + 1] == 'p')) {
    return (byte)(pcVar2[sVar1 + 2] + 0xbfU) < 0x1a;
  }
  return false;
}

Assistant:

bool startsWithOp(spv_text text, spv_position position) {
  if (text->length < position->index + 3) return false;
  char ch0 = text->str[position->index];
  char ch1 = text->str[position->index + 1];
  char ch2 = text->str[position->index + 2];
  return ('O' == ch0 && 'p' == ch1 && ('A' <= ch2 && ch2 <= 'Z'));
}